

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O2

void __thiscall tlx::Logger::~Logger(Logger *this)

{
  undefined *puVar1;
  string local_30 [32];
  
  std::operator<<((ostream *)this,'\n');
  puVar1 = s_logger_output_hook;
  std::__cxx11::stringbuf::str();
  (**(code **)(*(long *)puVar1 + 0x10))(puVar1,local_30);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  return;
}

Assistant:

Logger::~Logger() {
    oss_ << '\n';
    (*s_logger_output_hook).append_log_line(oss_.str());
}